

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int __thiscall AActor::GetTics(AActor *this,FState *newstate)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = (int)newstate->Tics;
  if (newstate->TicRange != 0) {
    uVar1 = FRandom::GenRand32(&FState::pr_statetics);
    iVar3 = iVar3 + uVar1 % (newstate->TicRange + 1);
  }
  uVar1 = (this->flags5).Value;
  if ((((short)uVar1 < 0) ||
      (((uVar1 >> 0x10 & 1) == 0 && (iVar2 = G_SkillProperty(SKILLP_FastMonsters), iVar2 != 0)))) &&
     ((newstate->StateFlags & 2) != 0)) {
    return iVar3 - (iVar3 >> 1);
  }
  iVar2 = G_SkillProperty(SKILLP_SlowMonsters);
  if (iVar2 != 0) {
    iVar3 = iVar3 << ((byte)newstate->StateFlags & 1);
  }
  return iVar3;
}

Assistant:

int AActor::GetTics(FState * newstate)
{
	int tics = newstate->GetTics();
	if (isFast() && newstate->GetFast())
	{
		return tics - (tics>>1);
	}
	else if (isSlow() && newstate->GetSlow())
	{
		return tics<<1;
	}
	return tics;
}